

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

void __thiscall svg::Shape::Shape(Shape *this,Fill *fill,Stroke *stroke)

{
  undefined3 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  (this->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Shape_00164598;
  (this->fill).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Fill_001644b8;
  (this->fill).color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00164468;
  uVar1 = *(undefined3 *)&(fill->color).field_0x9;
  iVar2 = (fill->color).red;
  iVar3 = (fill->color).green;
  iVar4 = (fill->color).blue;
  (this->fill).color.transparent = (fill->color).transparent;
  *(undefined3 *)&(this->fill).color.field_0x9 = uVar1;
  (this->fill).color.red = iVar2;
  (this->fill).color.green = iVar3;
  (this->fill).color.blue = iVar4;
  (this->stroke).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Stroke_001644f8;
  (this->stroke).width = stroke->width;
  (this->stroke).color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00164468;
  uVar1 = *(undefined3 *)&(stroke->color).field_0x9;
  iVar2 = (stroke->color).red;
  iVar3 = (stroke->color).green;
  iVar4 = (stroke->color).blue;
  (this->stroke).color.transparent = (stroke->color).transparent;
  *(undefined3 *)&(this->stroke).color.field_0x9 = uVar1;
  (this->stroke).color.red = iVar2;
  (this->stroke).color.green = iVar3;
  (this->stroke).color.blue = iVar4;
  (this->stroke).nonScaling = stroke->nonScaling;
  return;
}

Assistant:

Shape(Fill const & fill = Fill(), Stroke const & stroke = Stroke())
            : fill(fill), stroke(stroke) { }